

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IndexSpaceI.H
# Opt level: O0

void __thiscall
amrex::EB2::
IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>
::addFineLevels(IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>
                *this,int num_new_fine_levels)

{
  Long LVar1;
  iterator __first;
  uint uVar2;
  int in_ESI;
  uint uVar3;
  Real in_RDI;
  __normal_iterator<amrex::Geometry_*,_std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>
  __last;
  Geometry *unaff_retaddr;
  GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>
  *in_stack_00000008;
  IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>
  *in_stack_00000010;
  int i;
  int in_stack_000001d0;
  IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>
  fine_isp;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffd2c;
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
  *in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd38;
  int rr;
  Geometry *in_stack_fffffffffffffd40;
  size_type in_stack_fffffffffffffd48;
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
  *in_stack_fffffffffffffd50;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *this_00;
  __normal_iterator<amrex::Geometry_*,_std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>
  in_stack_fffffffffffffd70;
  const_iterator in_stack_fffffffffffffd78;
  int local_1d0;
  undefined1 in_stack_fffffffffffffff2;
  undefined1 in_stack_fffffffffffffff3;
  Real RVar5;
  
  rr = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  if (0 < in_ESI) {
    if (0 < *(int *)((long)in_RDI + 0x84)) {
      *(int *)((long)in_RDI + 0x84) = in_ESI + *(int *)((long)in_RDI + 0x84);
    }
    RVar5 = in_RDI;
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    refine(in_stack_fffffffffffffd40,rr);
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    uVar4 = *(undefined4 *)((long)in_RDI + 0x84);
    uVar3 = *(byte *)((long)in_RDI + 0x81) & 1;
    uVar2 = *(byte *)((long)in_RDI + 0x80) & 1;
    IndexSpaceImp(in_stack_00000010,in_stack_00000008,unaff_retaddr,(int)((ulong)RVar5 >> 0x20),
                  SUB84(RVar5,0),in_ESI,(bool)in_stack_fffffffffffffff3,
                  (bool)in_stack_fffffffffffffff2,in_stack_000001d0);
    Vector<amrex::Box,_std::allocator<amrex::Box>_>::size
              ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x4fed87);
    std::
    vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
    ::reserve(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    for (local_1d0 = 0;
        LVar1 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::size
                          ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x4fedd0),
        local_1d0 < LVar1; local_1d0 = local_1d0 + 1) {
      in_stack_fffffffffffffd78._M_current = (Geometry *)&stack0xffffffffffffff90;
      Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
      ::operator[]((Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd24,uVar3),
                   CONCAT44(in_stack_fffffffffffffd1c,uVar2));
      std::
      vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>>>
      ::
      emplace_back<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>>
                (in_stack_fffffffffffffd30,
                 (GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>
                  *)CONCAT44(in_stack_fffffffffffffd2c,uVar4));
    }
    std::
    swap<amrex::Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,amrex::EB2::BoxIF>,int>>>>>
              ((Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
                *)in_stack_fffffffffffffd30,
               (Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffd2c,uVar4));
    __last._M_current = (Geometry *)((long)in_RDI + 0xa0);
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::begin
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_fffffffffffffd1c,uVar2));
    __gnu_cxx::
    __normal_iterator<amrex::Geometry_const*,std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>>
    ::__normal_iterator<amrex::Geometry*>
              ((__normal_iterator<const_amrex::Geometry_*,_std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>
                *)CONCAT44(in_stack_fffffffffffffd24,uVar3),
               (__normal_iterator<amrex::Geometry_*,_std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>
                *)CONCAT44(in_stack_fffffffffffffd1c,uVar2));
    this_00 = (vector<amrex::Box,_std::allocator<amrex::Box>_> *)&stack0xffffffffffffffa8;
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::begin
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_fffffffffffffd1c,uVar2));
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::end
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_fffffffffffffd1c,uVar2));
    __first = std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
              insert<__gnu_cxx::__normal_iterator<amrex::Geometry*,std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>>,void>
                        ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)this_00,
                         in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,__last);
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
               CONCAT44(in_stack_fffffffffffffd1c,uVar2));
    __gnu_cxx::
    __normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>::
    __normal_iterator<amrex::Box*>
              ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                *)CONCAT44(in_stack_fffffffffffffd24,uVar3),
               (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                *)CONCAT44(in_stack_fffffffffffffd1c,uVar2));
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
               CONCAT44(in_stack_fffffffffffffd1c,uVar2));
    std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end
              ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
               CONCAT44(in_stack_fffffffffffffd1c,uVar2));
    std::vector<amrex::Box,std::allocator<amrex::Box>>::
    insert<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,void>
              (this_00,(const_iterator)in_stack_fffffffffffffd78._M_current,
               (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                )__first._M_current,
               (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                )__last._M_current);
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_fffffffffffffd1c,uVar2));
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               CONCAT44(in_stack_fffffffffffffd24,uVar3),
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               CONCAT44(in_stack_fffffffffffffd1c,uVar2));
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_fffffffffffffd1c,uVar2));
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_fffffffffffffd1c,uVar2));
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,_std::allocator<int>_> *)this_00,
               (const_iterator)in_stack_fffffffffffffd78._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current
              );
    ~IndexSpaceImp((IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::DifferenceIF<amrex::EB2::BoxIF,_amrex::EB2::BoxIF>,_int>_>
                    *)CONCAT44(in_stack_fffffffffffffd24,uVar3));
  }
  return;
}

Assistant:

void
IndexSpaceImp<G>::addFineLevels (int num_new_fine_levels)
{
    if (num_new_fine_levels <= 0) { return; }

    if (m_num_coarsen_opt > 0) {
        m_num_coarsen_opt += num_new_fine_levels;
    }

    IndexSpaceImp<G> fine_isp(m_gshop, amrex::refine(m_geom[0], 1<<num_new_fine_levels),
                              num_new_fine_levels-1, num_new_fine_levels-1,
                              m_ngrow[0], m_build_coarse_level_by_coarsening,
                              m_extend_domain_face, m_num_coarsen_opt);

    fine_isp.m_gslevel.reserve(m_domain.size()+num_new_fine_levels);
    for (int i = 0; i < m_domain.size(); ++i) {
        fine_isp.m_gslevel.emplace_back(std::move(m_gslevel[i]));
    }
    std::swap(fine_isp.m_gslevel, m_gslevel);

    m_geom.insert(m_geom.begin(), fine_isp.m_geom.begin(), fine_isp.m_geom.end());
    m_domain.insert(m_domain.begin(), fine_isp.m_domain.begin(), fine_isp.m_domain.end());
    m_ngrow.insert(m_ngrow.begin(), fine_isp.m_ngrow.begin(), fine_isp.m_ngrow.end());
}